

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitArrayGet(BinaryInstWriter *this,ArrayGet *curr)

{
  bool bVar1;
  BufferWithRandomAccess *this_00;
  U32LEB x;
  HeapType local_38;
  int local_30;
  HeapType local_28;
  HeapType heapType;
  
  bVar1 = wasm::Type::isNull(&curr->ref->type);
  if (bVar1) {
    emitUnreachable(this);
    return;
  }
  local_28 = wasm::Type::getHeapType(&curr->ref->type);
  HeapType::getArray(&local_38);
  x.value = 0xb;
  if ((local_38.id == 2) && (local_30 != 0)) {
    x.value = curr->signed_ ^ 0xd;
  }
  this_00 = BufferWithRandomAccess::operator<<(this->o,-5);
  BufferWithRandomAccess::operator<<(this_00,x);
  WasmBinaryWriter::writeIndexedHeapType(this->parent,local_28);
  return;
}

Assistant:

void BinaryInstWriter::visitArrayGet(ArrayGet* curr) {
  if (curr->ref->type.isNull()) {
    emitUnreachable();
    return;
  }
  auto heapType = curr->ref->type.getHeapType();
  const auto& field = heapType.getArray().element;
  int8_t op;
  if (field.type != Type::i32 || field.packedType == Field::not_packed) {
    op = BinaryConsts::ArrayGet;
  } else if (curr->signed_) {
    op = BinaryConsts::ArrayGetS;
  } else {
    op = BinaryConsts::ArrayGetU;
  }
  o << int8_t(BinaryConsts::GCPrefix) << U32LEB(op);
  parent.writeIndexedHeapType(heapType);
}